

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool wasm::DataFlow::allInputsIdentical(Node *node)

{
  bool bVar1;
  Node *pNVar2;
  size_type sVar3;
  Node *pNVar4;
  Node *curr;
  Index i;
  Node *first;
  Node *node_local;
  
  if (node->type == Expr) {
    bVar1 = Expression::is<wasm::Binary>((node->field_1).expr);
    if (bVar1) {
      pNVar2 = Node::getValue(node,0);
      pNVar4 = Node::getValue(node,1);
      bVar1 = Node::operator==(pNVar2,pNVar4);
      return bVar1;
    }
    bVar1 = Expression::is<wasm::Select>((node->field_1).expr);
    if (bVar1) {
      pNVar2 = Node::getValue(node,1);
      pNVar4 = Node::getValue(node,2);
      bVar1 = Node::operator==(pNVar2,pNVar4);
      return bVar1;
    }
  }
  else if (node->type == Phi) {
    pNVar2 = Node::getValue(node,1);
    curr._4_4_ = 2;
    while( true ) {
      sVar3 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                        (&node->values);
      if (sVar3 <= curr._4_4_) {
        return true;
      }
      pNVar4 = Node::getValue(node,curr._4_4_);
      bVar1 = Node::operator!=(pNVar2,pNVar4);
      if (bVar1) break;
      curr._4_4_ = curr._4_4_ + 1;
    }
    return false;
  }
  return false;
}

Assistant:

inline bool allInputsIdentical(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Binary>()) {
        return *(node->getValue(0)) == *(node->getValue(1));
      } else if (node->expr->is<Select>()) {
        return *(node->getValue(1)) == *(node->getValue(2));
      }
      break;
    }
    case Node::Type::Phi: {
      auto* first = node->getValue(1);
      // Check if any of the others are not equal
      for (Index i = 2; i < node->values.size(); i++) {
        auto* curr = node->getValue(i);
        if (*first != *curr) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}